

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O3

void __thiscall UrsaClient::check_task_status(UrsaClient *this,string *conn_id)

{
  source_loc loc;
  bool bVar1;
  reference pvVar2;
  reference this_00;
  const_reference pvVar3;
  logger *this_01;
  string_view trace;
  string_view_t fmt;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  response;
  unsigned_long ret;
  uint64_t work_done;
  value_type res_tasks;
  string res_str;
  uint64_t work_perc;
  uint64_t work_estimated;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  res;
  undefined1 local_130 [24];
  primitive_iterator_t local_118;
  byte local_110;
  undefined1 local_108 [8];
  json_value jStack_100;
  undefined8 local_f8;
  ulong local_e8;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_e0;
  undefined1 local_c0 [8];
  json_value local_b8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  long local_a8;
  char local_a0;
  undefined7 uStack_9f;
  UrsaClient *local_90;
  ulong local_88;
  ulong local_80;
  input_adapter local_78;
  undefined1 local_68 [16];
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  
  local_130._0_8_ = (pointer)0x7;
  local_130._8_8_ = "status;";
  trace._M_str = 
  "trace(/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/src/Client.cpp,15)";
  trace._M_len = 0x5f;
  local_90 = this;
  s_send<std::basic_string_view<char,std::char_traits<char>>>
            (&this->status_socket,(basic_string_view<char,_std::char_traits<char>_> *)local_130,
             trace,0);
  local_b0._M_current = &local_a0;
  local_a8 = 0;
  local_a0 = '\0';
  do {
    s_try_recv<std::__cxx11::string>
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_130,&this->status_socket);
    if (local_110 == 1) {
      std::__cxx11::string::_M_assign((string *)&local_b0);
    }
    if ((local_110 & 1) != 0) {
      local_110 = 0;
      if ((pointer)local_130._0_8_ != (pointer)(local_130 + 0x10)) {
        operator_delete((void *)local_130._0_8_,(ulong)(local_130._16_8_ + 1));
      }
    }
  } while (local_a8 == 0);
  nlohmann::detail::input_adapter::
  input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
            (&local_78,local_b0,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_b0._M_current + local_a8));
  local_48 = (code *)0x0;
  uStack_40 = 0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)local_68,&local_78,(parser_callback_t *)&local_58,true);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_78.ia.
      super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.ia.
               super___shared_ptr<nlohmann::detail::input_adapter_protocol,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)local_68,"result");
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)pvVar2,"tasks");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_c0,pvVar2);
  local_130._8_8_ = (_Rb_tree_node_base *)0x0;
  local_130._16_8_ = (pointer)0x0;
  local_118.m_it = -0x8000000000000000;
  if (local_c0[0] == null) {
    local_118.m_it = 1;
  }
  else {
    if (local_c0[0] == array) {
      local_130._16_8_ =
           ((local_b8.array)->
           super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_e0.m_it.object_iterator._M_node = (_Base_ptr)0x0;
      local_e0.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_e0.m_it.array_iterator._M_current =
           ((local_b8.array)->
           super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_00128ffc;
    }
    if (local_c0[0] == object) {
      local_130._8_8_ = ((local_b8.object)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      local_e0.m_it.array_iterator._M_current = (pointer)0x0;
      local_e0.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_e0.m_it.object_iterator._M_node =
           &((local_b8.object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
      goto LAB_00128ffc;
    }
    local_118.m_it = 0;
  }
  local_e0.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_e0.m_it.array_iterator._M_current = (pointer)0x0;
  local_e0.m_it.primitive_iterator.m_it = 1;
LAB_00128ffc:
  local_130._0_8_ =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)local_c0;
  local_e0.m_object =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)local_c0;
  while( true ) {
    bVar1 = nlohmann::detail::
            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
            ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)local_130,&local_e0);
    if (bVar1) break;
    this_00 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                           *)local_130);
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)this_00,"connection_id");
    jStack_100.object = (object_t *)0x0;
    local_108[0] = 3;
    jStack_100.object =
         (object_t *)
         nlohmann::
         basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
         ::create<std::__cxx11::string,std::__cxx11::string_const&>(conn_id);
    bVar1 = nlohmann::operator==(pvVar3,(const_reference)local_108);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_108 + 8),local_108[0]);
    if (bVar1) {
      pvVar3 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)this_00,"work_done");
      nlohmann::detail::
      get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_unsigned_long,_0>
                (pvVar3,(unsigned_long *)local_108);
      local_e8 = (ulong)local_108;
      pvVar3 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)this_00,"work_estimated");
      nlohmann::detail::
      get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_unsigned_long,_0>
                (pvVar3,(unsigned_long *)local_108);
      local_80 = (ulong)local_108;
      if (local_108 == (undefined1  [8])0x0) {
        local_88 = 0;
      }
      else {
        local_88 = (local_e8 * 100) / (ulong)local_108;
      }
      if (local_90->is_interactive == true) {
        this_01 = spdlog::default_logger_raw();
        local_108 = (undefined1  [8])0x0;
        jStack_100.object = (object_t *)0x0;
        local_f8 = 0;
        loc.funcname = (char *)0x0;
        loc.filename = (char *)0x0;
        loc.line = 0;
        loc._12_4_ = 0;
        fmt.size_ = 0x18;
        fmt.data_ = "Working... {}% ({} / {})";
        spdlog::logger::log<unsigned_long,unsigned_long,unsigned_long>
                  (this_01,loc,info,fmt,&local_88,&local_e8,&local_80);
      }
    }
    if (*(value_t *)local_130._0_8_ == array) {
      local_130._16_8_ = local_130._16_8_ + 0x10;
    }
    else if (*(value_t *)local_130._0_8_ == object) {
      local_130._8_8_ = std::_Rb_tree_increment((_Rb_tree_node_base *)local_130._8_8_);
    }
    else {
      local_118.m_it = local_118.m_it + 1;
    }
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_c0 + 8),local_c0[0]);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_68 + 8),(value_t)local_68[0]);
  if (local_b0._M_current != &local_a0) {
    operator_delete(local_b0._M_current,CONCAT71(uStack_9f,local_a0) + 1);
  }
  return;
}

Assistant:

void UrsaClient::check_task_status(const std::string &conn_id) {
    s_send<std::string_view>(&status_socket, "status;", ZMQTRACE);

    std::string res_str;
    while (res_str.empty()) {
        auto response{s_try_recv<std::string>(&status_socket)};
        if (response.has_value()) {
            res_str = *response;
        }
    }

    auto res = json::parse(res_str);
    auto res_tasks = res["result"]["tasks"];

    for (const auto &task : res_tasks) {
        if (task["connection_id"] != conn_id) {
            continue;
        }

        uint64_t work_done = task["work_done"];
        uint64_t work_estimated = task["work_estimated"];
        uint64_t work_perc =
            work_estimated > 0 ? work_done * 100 / work_estimated : 0;
        if (is_interactive) {
            spdlog::info("Working... {}% ({} / {})", work_perc, work_done,
                         work_estimated);
        }
    }
}